

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topk.cc
# Opt level: O2

void print_result(int f,priority_queue<std::pair<float,_v_array<char>_>,_std::vector<std::pair<float,_v_array<char>_>,_std::allocator<std::pair<float,_v_array<char>_>_>_>,_compare_scored_examples>
                        *pr_queue)

{
  float fVar1;
  pointer ppVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  v_array<char> tag;
  ulong uVar6;
  ostream *poVar7;
  int *piVar8;
  char *pcVar9;
  void *local_248;
  ulong local_240;
  char *local_228;
  char *pcStack_220;
  char *local_218;
  size_t sStack_210;
  char temp [30];
  stringstream ss;
  ostream local_1a8;
  
  if (-1 < f) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    while (ppVar2 = (pr_queue->c).
                    super__Vector_base<std::pair<float,_v_array<char>_>,_std::allocator<std::pair<float,_v_array<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
          ppVar2 != (pr_queue->c).
                    super__Vector_base<std::pair<float,_v_array<char>_>,_std::allocator<std::pair<float,_v_array<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
      fVar1 = ppVar2->first;
      pcVar9 = (ppVar2->second).end_array;
      sVar3 = (ppVar2->second).erase_count;
      pcVar4 = (ppVar2->second)._begin;
      pcVar5 = (ppVar2->second)._end;
      tag = ppVar2->second;
      std::
      priority_queue<std::pair<float,_v_array<char>_>,_std::vector<std::pair<float,_v_array<char>_>,_std::allocator<std::pair<float,_v_array<char>_>_>_>,_compare_scored_examples>
      ::pop(pr_queue);
      sprintf(temp,"%f",SUB84((double)fVar1,0));
      std::operator<<(&local_1a8,temp);
      std::operator<<(&local_1a8,' ');
      local_228 = pcVar4;
      pcStack_220 = pcVar5;
      local_218 = pcVar9;
      sStack_210 = sVar3;
      print_tag(&ss,tag);
      std::operator<<(&local_1a8,' ');
      std::operator<<(&local_1a8,'\n');
    }
    std::operator<<(&local_1a8,'\n');
    std::__cxx11::stringbuf::str();
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::stringbuf::str();
    uVar6 = write(f,local_248,local_240 & 0xffffffff);
    std::__cxx11::string::~string((string *)&local_248);
    if (uVar6 != local_240) {
      poVar7 = std::operator<<((ostream *)&std::cerr,"write error: ");
      piVar8 = __errno_location();
      pcVar9 = strerror(*piVar8);
      poVar7 = std::operator<<(poVar7,pcVar9);
      std::endl<char,std::char_traits<char>>(poVar7);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  return;
}

Assistant:

void print_result(int f, priority_queue<scored_example, vector<scored_example>, compare_scored_examples>& pr_queue)
{
  if (f >= 0)
  {
    char temp[30];
    std::stringstream ss;
    scored_example tmp_example;
    while (!pr_queue.empty())
    {
      tmp_example = pr_queue.top();
      pr_queue.pop();
      sprintf(temp, "%f", tmp_example.first);
      ss << temp;
      ss << ' ';
      print_tag(ss, tmp_example.second);
      ss << ' ';
      ss << '\n';
    }
    ss << '\n';
    ssize_t len = ss.str().size();
#ifdef _WIN32
    ssize_t t = _write(f, ss.str().c_str(), (unsigned int)len);
#else
    ssize_t t = write(f, ss.str().c_str(), (unsigned int)len);
#endif
    if (t != len)
      cerr << "write error: " << strerror(errno) << endl;
  }
}